

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotgrowth.c
# Opt level: O3

float cPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  void *addr;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  singlecomplex *psVar17;
  float fVar18;
  float fVar19;
  float local_bc;
  long local_90;
  
  local_bc = smach("S");
  pvVar4 = A->Store;
  pvVar5 = L->Store;
  pvVar6 = U->Store;
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  lVar9 = *(long *)((long)pvVar6 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  if (0 < A->ncol) {
    lVar12 = 0;
    do {
      *(int *)((long)addr + (long)perm_c[lVar12] * 4) = (int)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < A->ncol);
  }
  local_bc = 1.0 / local_bc;
  local_90 = 0;
  do {
    if (*(int *)((long)pvVar5 + 4) < local_90) break;
    iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x30) + local_90 * 4);
    bVar10 = iVar1 < ncols;
    if ((iVar1 < ncols) && (iVar1 < *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + local_90 * 4))) {
      lVar14 = (long)iVar1;
      lVar12 = lVar8 + (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar14 * 4) * 8;
      iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar14 * 4);
      iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar14 * 4);
      lVar16 = 8;
      do {
        lVar15 = (long)*(int *)((long)addr + lVar14 * 4);
        iVar3 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar15 * 4);
        lVar13 = (long)iVar3;
        fVar19 = 0.0;
        fVar18 = 0.0;
        if (iVar3 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar15 * 4)) {
          psVar17 = (singlecomplex *)(lVar7 + lVar13 * 8);
          fVar18 = 0.0;
          do {
            dVar11 = c_abs1(psVar17);
            if ((double)fVar18 <= dVar11) {
              dVar11 = c_abs1(psVar17);
              fVar18 = (float)dVar11;
            }
            lVar13 = lVar13 + 1;
            psVar17 = psVar17 + 1;
          } while (lVar13 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar15 * 4));
        }
        iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar14 * 4);
        lVar15 = (long)iVar3;
        lVar13 = lVar14 + 1;
        if (iVar3 < *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar14 * 4)) {
          psVar17 = (singlecomplex *)(lVar9 + lVar15 * 8);
          fVar19 = 0.0;
          do {
            dVar11 = c_abs1(psVar17);
            if ((double)fVar19 <= dVar11) {
              dVar11 = c_abs1(psVar17);
              fVar19 = (float)dVar11;
            }
            lVar15 = lVar15 + 1;
            psVar17 = psVar17 + 1;
          } while (lVar15 < *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar13 * 4));
        }
        lVar14 = 0;
        do {
          dVar11 = c_abs1((singlecomplex *)(lVar12 + lVar14));
          if ((double)fVar19 <= dVar11) {
            dVar11 = c_abs1((singlecomplex *)(lVar12 + lVar14));
            fVar19 = (float)dVar11;
          }
          lVar14 = lVar14 + 8;
        } while (lVar16 != lVar14);
        fVar18 = (float)(-(uint)(fVar19 == 0.0) & 0x3f800000 |
                        ~-(uint)(fVar19 == 0.0) & (uint)(fVar18 / fVar19));
        if (fVar18 <= local_bc) {
          local_bc = fVar18;
        }
        bVar10 = lVar13 < ncols;
        if (ncols <= lVar13) break;
        lVar12 = lVar12 + (long)iVar1 * 8 + (long)iVar2 * -8;
        lVar16 = lVar16 + 8;
        lVar14 = lVar13;
      } while (lVar13 < *(int *)(*(long *)((long)pvVar5 + 0x30) + (local_90 + 1) * 4));
    }
    local_90 = local_90 + 1;
  } while (bVar10);
  superlu_free(addr);
  return local_bc;
}

Assistant:

float
cPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    float   rpg, maxaj, maxuj;
    float   smlnum;
    singlecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = smach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, c_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}